

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox_p.cpp
# Opt level: O0

void QComboBoxPrivateContainer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QComboBoxPrivateContainer *_t;
  QComboBoxPrivateContainer *in_stack_ffffffffffffffc0;
  QComboBoxPrivateContainer *in_stack_ffffffffffffffd8;
  
  if (in_ESI == 0) {
    switch((QModelIndex *)(ulong)in_EDX) {
    case (QModelIndex *)0x0:
      itemSelected(in_stack_ffffffffffffffc0,(QModelIndex *)(ulong)in_EDX);
      break;
    case (QModelIndex *)0x1:
      resetButton((QComboBoxPrivateContainer *)0x53ec91);
      break;
    case (QModelIndex *)0x2:
      scrollItemView(in_stack_ffffffffffffffc0,0);
      break;
    case (QModelIndex *)0x3:
      hideScrollers(in_stack_ffffffffffffffc0);
      break;
    case (QModelIndex *)0x4:
      updateScrollers(in_stack_ffffffffffffffd8);
      break;
    case (QModelIndex *)0x5:
      viewDestroyed(in_stack_ffffffffffffffc0);
    }
  }
  if ((in_ESI == 5) &&
     (bVar1 = QtMocHelpers::indexOfMethod<void(QComboBoxPrivateContainer::*)(QModelIndex_const&)>
                        (in_RCX,(void **)itemSelected,0,0), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QComboBoxPrivateContainer::*)()>
              (in_RCX,(void **)resetButton,0,1);
  }
  return;
}

Assistant:

void QComboBoxPrivateContainer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBoxPrivateContainer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemSelected((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->resetButton(); break;
        case 2: _t->scrollItemView((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->hideScrollers(); break;
        case 4: _t->updateScrollers(); break;
        case 5: _t->viewDestroyed(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateContainer::*)(const QModelIndex & )>(_a, &QComboBoxPrivateContainer::itemSelected, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateContainer::*)()>(_a, &QComboBoxPrivateContainer::resetButton, 1))
            return;
    }
}